

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O1

nodeid_t __thiscall BasePort::ConvertBoardToNode(BasePort *this,uchar boardId)

{
  byte bVar1;
  
  bVar1 = boardId & 0x3f;
  if (bVar1 < 0x10) {
    return this->Board2Node[bVar1];
  }
  return (bVar1 != 0x3f) + 0x3f;
}

Assistant:

nodeid_t BasePort::ConvertBoardToNode(unsigned char boardId) const
{
    nodeid_t node = MAX_NODES;                  // Invalid value
    boardId = boardId&FW_NODE_MASK;
    if (boardId < BoardIO::MAX_BOARDS)
        node = GetNodeId(boardId);
    else if (boardId == FW_NODE_BROADCAST)
        node = FW_NODE_BROADCAST;
    return node;
}